

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O0

void __thiscall glslang::TSymbol::dumpExtensions(TSymbol *this,TInfoSink *infoSink)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  TInfoSinkBase *this_00;
  int local_20;
  int i;
  int numExtensions;
  TInfoSink *infoSink_local;
  TSymbol *this_local;
  
  iVar1 = (*this->_vptr_TSymbol[0x11])();
  if (iVar1 != 0) {
    TInfoSinkBase::operator<<(&infoSink->debug," <");
    for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
      iVar2 = (*this->_vptr_TSymbol[0x12])();
      this_00 = TInfoSinkBase::operator<<
                          (&infoSink->debug,
                           *(char **)(CONCAT44(extraout_var,iVar2) + (long)local_20 * 8));
      TInfoSinkBase::operator<<(this_00,",");
    }
    TInfoSinkBase::operator<<(&infoSink->debug,">");
  }
  return;
}

Assistant:

void TSymbol::dumpExtensions(TInfoSink& infoSink) const
{
    int numExtensions = getNumExtensions();
    if (numExtensions) {
        infoSink.debug << " <";

        for (int i = 0; i < numExtensions; i++)
            infoSink.debug << getExtensions()[i] << ",";

        infoSink.debug << ">";
    }
}